

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
          (CThreadSynchronizationInfo *this)

{
  _DeferredSignalingListNode *p;
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  PAL_ERROR PVar3;
  ThreadNativeWaitData *pTVar4;
  int local_4c;
  PLIST_ENTRY _EX_Flink;
  PLIST_ENTRY _EX_Blink;
  DeferredSignalingListNode *pdsln;
  PLIST_ENTRY pLink;
  PAL_ERROR palTempErr;
  LONG lIdx;
  LONG lArrayPendingSignalingCount;
  PAL_ERROR palErr;
  CThreadSynchronizationInfo *this_local;
  
  lIdx = 0;
  if (this->m_lPendingSignalingCount < 0) {
    fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xfaa);
    fprintf(_stderr,"Expression: 0 <= m_lPendingSignalingCount\n");
  }
  if (0 < this->m_lPendingSignalingCount) {
    if (this->m_lPendingSignalingCount < 0xb) {
      local_4c = this->m_lPendingSignalingCount;
    }
    else {
      local_4c = 10;
    }
    for (pLink._4_4_ = 0; pLink._4_4_ < local_4c; pLink._4_4_ = pLink._4_4_ + 1) {
      pTVar4 = GetNativeData(&this->m_rgpthrPendingSignalings[pLink._4_4_]->synchronizationInfo);
      PVar3 = CPalSynchronizationManager::SignalThreadCondition(pTVar4);
      if (PVar3 != 0) {
        lIdx = PVar3;
      }
      CPalThread::ReleaseThreadReference(this->m_rgpthrPendingSignalings[pLink._4_4_]);
    }
    if (10 < this->m_lPendingSignalingCount) {
      while ((this->m_lePendingSignalingsOverflowList).Flink !=
             &this->m_lePendingSignalingsOverflowList) {
        p = (_DeferredSignalingListNode *)(this->m_lePendingSignalingsOverflowList).Flink;
        p_Var1 = ((this->m_lePendingSignalingsOverflowList).Flink)->Flink;
        p_Var2 = ((this->m_lePendingSignalingsOverflowList).Flink)->Blink;
        p_Var2->Flink = p_Var1;
        p_Var1->Blink = p_Var2;
        pTVar4 = GetNativeData(&p->pthrTarget->synchronizationInfo);
        PVar3 = CPalSynchronizationManager::SignalThreadCondition(pTVar4);
        if (PVar3 != 0) {
          lIdx = PVar3;
        }
        CPalThread::ReleaseThreadReference(p->pthrTarget);
        InternalDelete<CorUnix::_DeferredSignalingListNode>(p);
        pLink._4_4_ = pLink._4_4_ + 1;
      }
      if (pLink._4_4_ != this->m_lPendingSignalingCount) {
        fprintf(_stderr,"] %s %s:%d","RunDeferredThreadConditionSignalings",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xfe3);
        fprintf(_stderr,"Expression: lIdx == m_lPendingSignalingCount\n");
      }
    }
    this->m_lPendingSignalingCount = 0;
  }
  return lIdx;
}

Assistant:

PAL_ERROR CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings()
    {
        PAL_ERROR palErr = NO_ERROR;

        _ASSERTE(0 <= m_lPendingSignalingCount);

        if (0 < m_lPendingSignalingCount)
        {
            LONG lArrayPendingSignalingCount =
                min(PendingSignalingsArraySize, m_lPendingSignalingCount);
            LONG lIdx = 0;
            PAL_ERROR palTempErr;

            // Signal all the pending signalings from the array
            for (lIdx = 0; lIdx < lArrayPendingSignalingCount; lIdx++)
            {
                // Do the actual signaling
                palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                    m_rgpthrPendingSignalings[lIdx]->synchronizationInfo.GetNativeData());
                if (NO_ERROR != palTempErr)
                {
                    palErr = palTempErr;
                }

                // Release the thread reference
                m_rgpthrPendingSignalings[lIdx]->ReleaseThreadReference();
            }

            // Signal any pending signalings from the array overflow list
            if (m_lPendingSignalingCount > PendingSignalingsArraySize)
            {
                PLIST_ENTRY pLink;
                DeferredSignalingListNode * pdsln;

                while (!IsListEmpty(&m_lePendingSignalingsOverflowList))
                {
                    // Remove a node from the head of the queue
                    // Note: no need to synchronize the access to this list since
                    // it is meant to be accessed only by the owner thread.
                    pLink = RemoveHeadList(&m_lePendingSignalingsOverflowList);
                    pdsln = CONTAINING_RECORD(pLink,
                                              DeferredSignalingListNode,
                                              Link);

                    // Do the actual signaling
                    palTempErr = CPalSynchronizationManager::SignalThreadCondition(
                        pdsln->pthrTarget->synchronizationInfo.GetNativeData());
                    if (NO_ERROR != palTempErr)
                    {
                        palErr = palTempErr;
                    }

                    // Release the thread reference
                    pdsln->pthrTarget->ReleaseThreadReference();

                    // Delete the node
                    InternalDelete(pdsln);

                    lIdx += 1;
                }

                _ASSERTE(lIdx == m_lPendingSignalingCount);
            }

            // Reset the counter of pending signalings for this thread
            m_lPendingSignalingCount = 0;
        }

        return palErr;
    }